

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

size_t UA_calcSizeBinary(void *p,UA_DataType *type)

{
  byte bVar1;
  UA_DataTypeMember *pUVar2;
  ulong uVar3;
  size_t sVar4;
  long lVar5;
  UA_DataType *type_00;
  size_t *psVar6;
  size_t sVar7;
  UA_DataType *typelists [2];
  
  bVar1 = type->membersSize;
  typelists[1] = type;
  typelists[0] = type + -(ulong)type->typeIndex;
  sVar7 = 0;
  for (lVar5 = 0; (ulong)bVar1 * 0x10 != lVar5; lVar5 = lVar5 + 0x10) {
    pUVar2 = typelists[1]->members;
    type_00 = typelists[(ulong)(~(uint)(byte)(&pUVar2->field_0xb)[lVar5] & 1) - 1] +
              *(ushort *)((long)&pUVar2->memberTypeIndex + lVar5);
    psVar6 = (size_t *)((long)p + (ulong)(&pUVar2->padding)[lVar5]);
    if (((&pUVar2->field_0xb)[lVar5] & 2) == 0) {
      uVar3 = 0x19;
      if ((type_00->field_0x25 & 1) != 0) {
        uVar3 = (ulong)type_00->typeIndex;
      }
      sVar4 = (*(code *)(&calcSizeBinaryJumpTable)[uVar3])(psVar6,type_00);
      uVar3 = (ulong)type_00->memSize;
    }
    else {
      sVar4 = Array_calcSizeBinary((void *)psVar6[1],*psVar6,type_00);
      uVar3 = 0x10;
    }
    p = (void *)((long)psVar6 + uVar3);
    sVar7 = sVar7 + sVar4;
  }
  return sVar7;
}

Assistant:

size_t
UA_calcSizeBinary(void *p, const UA_DataType *type) {
    size_t s = 0;
    uintptr_t ptr = (uintptr_t)p;
    UA_Byte membersSize = type->membersSize;
    const UA_DataType *typelists[2] = { UA_TYPES, &type[-type->typeIndex] };
    for(size_t i = 0; i < membersSize; ++i) {
        const UA_DataTypeMember *member = &type->members[i];
        const UA_DataType *membertype = &typelists[!member->namespaceZero][member->memberTypeIndex];
        if(!member->isArray) {
            ptr += member->padding;
            size_t encode_index = membertype->builtin ? membertype->typeIndex : UA_BUILTIN_TYPES_COUNT;
            s += calcSizeBinaryJumpTable[encode_index]((const void*)ptr, membertype);
            ptr += membertype->memSize;
        } else {
            ptr += member->padding;
            const size_t length = *((const size_t*)ptr);
            ptr += sizeof(size_t);
            s += Array_calcSizeBinary(*(void *UA_RESTRICT const *)ptr, length, membertype);
            ptr += sizeof(void*);
        }
    }
    return s;
}